

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::sectionNodeOf(BaseBuilder *this,SectionNode **out,uint32_t sectionId)

{
  ZoneVector<asmjit::v1_14::SectionNode_*> *this_00;
  CodeHolder *pCVar1;
  SectionNode *pSVar2;
  Error EVar3;
  uint uVar4;
  SectionNode **ppSVar5;
  uint32_t sectionId_local;
  SectionNode *node;
  
  *out = (SectionNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    return 5;
  }
  sectionId_local = sectionId;
  if (*(uint *)&pCVar1->field_0xe0 <= sectionId) {
    EVar3 = 0x13;
LAB_0010f75f:
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar3,(char *)0x0);
    return EVar3;
  }
  this_00 = &this->_sectionNodes;
  uVar4 = *(uint *)&this->field_0x180;
  if (uVar4 <= sectionId) {
    EVar3 = ZoneVector<asmjit::v1_14::SectionNode_*>::reserve
                      (this_00,&this->_allocator,sectionId + 1);
    if (EVar3 != 0) goto LAB_0010f75f;
    uVar4 = *(uint *)&this->field_0x180;
  }
  node = (SectionNode *)0x0;
  if (sectionId < uVar4) {
    ppSVar5 = ZoneVector<asmjit::v1_14::SectionNode_*>::operator[](this_00,(ulong)sectionId);
    node = *ppSVar5;
    if (node != (SectionNode *)0x0) goto LAB_0010f73c;
  }
  EVar3 = _newNodeT<asmjit::v1_14::SectionNode,unsigned_int&>(this,&node,&sectionId_local);
  if (EVar3 != 0) {
    return EVar3;
  }
  if (*(uint *)&this->field_0x180 <= sectionId_local) {
    ZoneVector<asmjit::v1_14::SectionNode_*>::resize(this_00,&this->_allocator,sectionId_local + 1);
  }
  pSVar2 = node;
  ppSVar5 = ZoneVector<asmjit::v1_14::SectionNode_*>::operator[](this_00,(ulong)sectionId_local);
  *ppSVar5 = pSVar2;
LAB_0010f73c:
  *out = node;
  return 0;
}

Assistant:

Error BaseBuilder::sectionNodeOf(SectionNode** out, uint32_t sectionId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (ASMJIT_UNLIKELY(!_code->isSectionValid(sectionId)))
    return reportError(DebugUtils::errored(kErrorInvalidSection));

  if (sectionId >= _sectionNodes.size()) {
    Error err = _sectionNodes.reserve(&_allocator, sectionId + 1);
    if (ASMJIT_UNLIKELY(err != kErrorOk))
      return reportError(err);
  }

  SectionNode* node = nullptr;
  if (sectionId < _sectionNodes.size())
    node = _sectionNodes[sectionId];

  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<SectionNode>(&node, sectionId));

    // We have already reserved enough space, this cannot fail now.
    if (sectionId >= _sectionNodes.size())
      _sectionNodes.resize(&_allocator, sectionId + 1);

    _sectionNodes[sectionId] = node;
  }

  *out = node;
  return kErrorOk;
}